

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::_cp
          (stack<c4::yml::Parser::State,_16UL> *this,stack<c4::yml::Parser::State,_16UL> *that)

{
  ulong uVar1;
  code *pcVar2;
  void *pvVar3;
  pfn_allocate p_Var4;
  pfn_error p_Var5;
  bool bVar6;
  ulong uVar7;
  
  if ((stack<c4::yml::Parser::State,_16UL> *)that->m_stack == that) {
    if (0x10 < that->m_capacity) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: that->m_capacity <= N",0x23,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (that->m_size <= that->m_capacity) goto LAB_001f1a6a;
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
  }
  else {
    if (that->m_capacity < 0x11) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      (*(code *)PTR_error_impl_0023e4c8)
                ("check failed: that->m_capacity > N",0x22,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (that->m_size <= that->m_capacity) goto LAB_001f1a6a;
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
  }
  (*(code *)PTR_error_impl_0023e4c8)
            ("check failed: that->m_size <= that->m_capacity",0x2e,
             (anonymous_namespace)::s_default_callbacks);
LAB_001f1a6a:
  memcpy(this->m_stack,that->m_stack,that->m_size * 0x98);
  uVar1 = that->m_size;
  this->m_size = uVar1;
  uVar7 = 0x10;
  if (0x10 < uVar1) {
    uVar7 = uVar1;
  }
  this->m_capacity = uVar7;
  pvVar3 = (that->m_callbacks).m_user_data;
  p_Var4 = (that->m_callbacks).m_allocate;
  p_Var5 = (that->m_callbacks).m_error;
  (this->m_callbacks).m_free = (that->m_callbacks).m_free;
  (this->m_callbacks).m_error = p_Var5;
  (this->m_callbacks).m_user_data = pvVar3;
  (this->m_callbacks).m_allocate = p_Var4;
  return;
}

Assistant:

void stack<T, N>::_cp(stack const* C4_RESTRICT that)
{
    if(that->m_stack != that->m_buf)
    {
        RYML_ASSERT(that->m_capacity > N);
        RYML_ASSERT(that->m_size <= that->m_capacity);
    }
    else
    {
        RYML_ASSERT(that->m_capacity <= N);
        RYML_ASSERT(that->m_size <= that->m_capacity);
    }
    memcpy(m_stack, that->m_stack, that->m_size * sizeof(T));
    m_size = that->m_size;
    m_capacity = that->m_size < N ? N : that->m_size;
    m_callbacks = that->m_callbacks;
}